

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManSeqEquivDivide(Gia_Man_t *p,Cec_ParCor_t *pPars)

{
  int v;
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint local_38;
  int local_34;
  int i;
  int n;
  Gia_Obj_t *pObj;
  Gia_Man_t *pParts [2];
  Cec_ParCor_t *pPars_local;
  Gia_Man_t *p_local;
  
  pParts[1] = (Gia_Man_t *)pPars;
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    pGVar1 = Gia_ManDupHalfSeq(p,local_34);
    pParts[(long)local_34 + -1] = pGVar1;
    Cec_ManLSCorrespondenceClasses(pParts[(long)local_34 + -1],(Cec_ParCor_t *)pParts[1]);
    local_38 = 0;
    while( true ) {
      bVar3 = false;
      if ((int)local_38 < p->nObjs) {
        _i = Gia_ManObj(p,local_38);
        bVar3 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      if (_i->Value != 0xffffffff) {
        pGVar1 = pParts[(long)local_34 + -1];
        v = Abc_Lit2Var(_i->Value);
        pGVar2 = Gia_ManObj(pGVar1,v);
        pGVar2->Value = local_38;
      }
      local_38 = local_38 + 1;
    }
  }
  Gia_ManSeqEquivMerge(p,(Gia_Man_t **)&pObj);
  Gia_ManStop((Gia_Man_t *)pObj);
  Gia_ManStop(pParts[0]);
  return;
}

Assistant:

void Gia_ManSeqEquivDivide( Gia_Man_t * p, Cec_ParCor_t * pPars )
{
    Gia_Man_t * pParts[2];
    Gia_Obj_t * pObj;
    int n, i;
    for ( n = 0; n < 2; n++ )
    {
        // derive n-th part of the AIG
        pParts[n] = Gia_ManDupHalfSeq( p, n );
        //Gia_ManPrintStats( pParts[n], NULL );
        // compute equivalences (recorded internally using pReprs and pNexts)
        Cec_ManLSCorrespondenceClasses( pParts[n], pPars );
        // make the nodes of the part AIG point to their prototypes in the AIG
        Gia_ManForEachObj( p, pObj, i )
            if ( ~pObj->Value )
                Gia_ManObj( pParts[n], Abc_Lit2Var(pObj->Value) )->Value = i;
    }
    Gia_ManSeqEquivMerge( p, pParts );
    Gia_ManStop( pParts[0] );
    Gia_ManStop( pParts[1] );
}